

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O3

void __thiscall
duckdb::CheckpointReader::ReadTable
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  Catalog *pCVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  int iVar2;
  pointer pCVar3;
  SchemaCatalogEntry *schema;
  pointer pBVar4;
  create_info_set_t *pcVar5;
  type pBVar6;
  __node_base *p_Var7;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  undefined1 local_d0 [48];
  _Alloc_hider _Stack_a0;
  transaction_t local_98;
  undefined8 local_88;
  ClientContext *pCStack_80;
  _Alloc_hider local_78;
  __node_base _Stack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  DatabaseInstance *local_58;
  ClientContext *pCStack_50;
  __node_base local_48;
  transaction_t tStack_40;
  __node_base local_38;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"table");
  local_d0._8_8_ = (element_type *)0x0;
  iVar2 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar2 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)local_d0,deserializer);
    local_d0._8_8_ = local_d0._0_8_;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar1 = this->catalog;
  local_38._M_nxt = (_Hash_node_base *)transaction.start_time;
  local_48._M_nxt = (_Hash_node_base *)transaction.transaction.ptr;
  tStack_40 = transaction.transaction_id;
  local_58 = transaction.db.ptr;
  pCStack_50 = transaction.context.ptr;
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)(local_d0 + 8));
  transaction_00.context.ptr._0_4_ = (int)pCStack_50;
  transaction_00.db.ptr = local_58;
  transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_50 >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)local_48._M_nxt;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_48._M_nxt >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)tStack_40;
  transaction_00.transaction_id._4_4_ = (int)(tStack_40 >> 0x20);
  transaction_00.start_time = (transaction_t)local_38._M_nxt;
  schema = Catalog::GetSchema(pCVar1,transaction_00,&pCVar3->schema);
  local_d0._16_8_ = local_d0._8_8_;
  local_d0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Binder::BindCreateTableCheckpoint
            ((Binder *)local_d0,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             (local_d0 + 0x10),schema);
  if ((BoundCreateTableInfo *)local_d0._16_8_ != (BoundCreateTableInfo *)0x0) {
    (**(code **)(*(long *)local_d0._16_8_ + 8))();
  }
  local_d0._16_8_ = (pointer)0x0;
  pBVar4 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_d0);
  pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&pBVar4->base);
  pcVar5 = LogicalDependencyList::Set(&pCVar3->dependencies);
  p_Var7 = &(pcVar5->_M_h)._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    pBVar4 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_d0);
    LogicalDependencyList::AddDependency(&pBVar4->dependencies,(LogicalDependency *)(p_Var7 + 1));
  }
  local_68._M_allocated_capacity = transaction.start_time;
  local_78._M_p = (pointer)transaction.transaction.ptr;
  _Stack_70._M_nxt = (_Hash_node_base *)transaction.transaction_id;
  local_88 = transaction.db.ptr;
  pCStack_80 = transaction.context.ptr;
  pBVar6 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)local_d0);
  (*this->_vptr_CheckpointReader[0xc])(this,deserializer,pBVar6);
  pCVar1 = this->catalog;
  local_98 = transaction.start_time;
  local_d0._40_8_ = transaction.transaction.ptr;
  _Stack_a0._M_p = (pointer)transaction.transaction_id;
  local_d0._24_8_ = transaction.db.ptr;
  local_d0._32_8_ = transaction.context.ptr;
  pBVar6 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)local_d0);
  transaction_01.context.ptr._0_4_ = (int)local_d0._32_8_;
  transaction_01.db.ptr = (DatabaseInstance *)local_d0._24_8_;
  transaction_01.context.ptr._4_4_ = SUB84(local_d0._32_8_,4);
  transaction_01.transaction.ptr._0_4_ = (int)local_d0._40_8_;
  transaction_01.transaction.ptr._4_4_ = SUB84(local_d0._40_8_,4);
  transaction_01.transaction_id._0_4_ = (int)_Stack_a0._M_p;
  transaction_01.transaction_id._4_4_ = (int)((ulong)_Stack_a0._M_p >> 0x20);
  transaction_01.start_time = local_98;
  Catalog::CreateTable(pCVar1,transaction_01,pBVar6);
  if ((element_type *)local_d0._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_d0,
               (BoundCreateTableInfo *)local_d0._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_d0._8_8_)[1])();
  }
  return;
}

Assistant:

void CheckpointReader::ReadTable(CatalogTransaction transaction, Deserializer &deserializer) {
	// deserialize the table meta data
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "table");
	auto &schema = catalog.GetSchema(transaction, info->schema);
	auto bound_info = Binder::BindCreateTableCheckpoint(std::move(info), schema);

	for (auto &dep : bound_info->Base().dependencies.Set()) {
		bound_info->dependencies.AddDependency(dep);
	}

	// now read the actual table data and place it into the CreateTableInfo
	ReadTableData(transaction, deserializer, *bound_info);

	// finally create the table in the catalog
	catalog.CreateTable(transaction, *bound_info);
}